

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableSetColumnWidthAutoAll(ImGuiTable *table)

{
  int iVar1;
  ImGuiTableColumn *pIVar2;
  long lVar3;
  int column_n;
  long lVar4;
  
  iVar1 = table->ColumnsCount;
  lVar3 = 100;
  for (lVar4 = 0; lVar4 < iVar1; lVar4 = lVar4 + 1) {
    pIVar2 = (table->Columns).Data;
    if ((*(char *)((long)pIVar2 + lVar3 + -10) != '\0') ||
       ((*(byte *)((long)pIVar2 + lVar3 + -100) & 8) != 0)) {
      *(undefined2 *)((long)pIVar2 + lVar3 + -1) = 0x102;
    }
    lVar3 = lVar3 + 0x68;
  }
  return;
}

Assistant:

void ImGui::TableSetColumnWidthAutoAll(ImGuiTable* table)
{
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (!column->IsEnabled && !(column->Flags & ImGuiTableColumnFlags_WidthStretch)) // Cannot reset weight of hidden stretch column
            continue;
        column->CannotSkipItemsQueue = (1 << 0);
        column->AutoFitQueue = (1 << 1);
    }
}